

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O2

CompiledFilter __thiscall Rml::FilterBasic::CompileFilter(FilterBasic *this,Element *element)

{
  RenderManager *name;
  Element *in_RDX;
  unsigned_long extraout_RDX;
  CompiledFilter CVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  allocator_type local_aa;
  key_compare local_a9;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  Variant local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_68;
  
  name = Element::GetRenderManager(in_RDX);
  Variant::Variant<float_const&,void>
            (&local_90,
             (float *)&(element->children).
                       super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::pair<const_char_(&)[6],_Rml::Variant,_true>(&local_68,(char (*) [6])0x31c259,&local_90);
  init._M_len = 1;
  init._M_array = &local_68;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a8,init,&local_a9,&local_aa);
  RenderManager::CompileFilter
            ((RenderManager *)this,(String *)name,
             (Dictionary *)&element->super_EnableObserverPtr<Rml::Element>);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_a8.m_container);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  ::~pair(&local_68);
  Variant::~Variant(&local_90);
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.resource_handle =
       extraout_RDX;
  CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)this;
  return (CompiledFilter)CVar1.super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>;
}

Assistant:

CompiledFilter FilterBasic::CompileFilter(Element* element) const
{
	return element->GetRenderManager()->CompileFilter(name, Dictionary{{"value", Variant(value)}});
}